

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall
CDirectiveHeaderSize::CDirectiveHeaderSize(CDirectiveHeaderSize *this,Expression *expression)

{
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveHeaderSize_001b9168;
  Expression::Expression(&this->expression,expression);
  return;
}

Assistant:

CDirectiveHeaderSize::CDirectiveHeaderSize(Expression expression)
	: expression(expression) {}